

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O1

HRESULT __thiscall ConfigParser::SetOutputFile(ConfigParser *this,WCHAR *outputFile,WCHAR *openMode)

{
  short *psVar1;
  short sVar2;
  WCHAR WVar3;
  code *pcVar4;
  DWORD DVar5;
  int iVar6;
  HRESULT HVar7;
  char16_t *pcVar8;
  size_t sVar9;
  size_t sVar10;
  WCHAR *pWVar11;
  WCHAR *pWVar12;
  ulong uVar13;
  PAL_FILE *file;
  undefined4 *puVar14;
  long lVar15;
  ulong uVar16;
  WCHAR *pWVar17;
  size_t __n;
  WCHAR *_Src;
  long lVar18;
  WCHAR *pWVar19;
  long lVar20;
  char16_t *pcVar21;
  WCHAR *pWVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  char16 local_678;
  short sStack_676;
  short local_674;
  short local_672;
  char16 moduleName [260];
  char16_t local_468 [4];
  WCHAR buffer [260];
  WCHAR local_258;
  undefined1 local_256 [6];
  char16 fileName [260];
  
  pcVar8 = PAL_wcsstr(outputFile,L"{PID}");
  if (pcVar8 == (char16_t *)0x0) goto LAB_00363b87;
  lVar25 = (long)pcVar8 - (long)outputFile >> 1;
  lVar18 = (long)pcVar8 - (long)outputFile;
  if (lVar18 == 0) {
    pcVar21 = local_468 + 1;
    local_468[0] = L'\0';
    __n = 0x206;
LAB_003639f4:
    memset(pcVar21,0xfd,__n);
  }
  else if (outputFile == (WCHAR *)0x0) {
LAB_00363a0a:
    local_468[0] = L'\0';
    memset(local_468 + 1,0xfd,0x206);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else {
    lVar20 = lVar25;
    if (lVar18 == -2) {
      lVar24 = 0x104;
      lVar15 = 0;
      do {
        sVar2 = *(short *)((long)outputFile + lVar15);
        *(short *)((long)local_468 + lVar15) = sVar2;
        if (sVar2 == 0) goto LAB_003639cb;
        lVar15 = lVar15 + 2;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 0);
      lVar24 = 0;
    }
    else {
      lVar24 = 0x104;
      lVar15 = 0;
      do {
        lVar23 = lVar15;
        sVar2 = *(short *)((long)outputFile + lVar23);
        *(short *)((long)local_468 + lVar23) = sVar2;
        if (sVar2 == 0) goto LAB_003639ba;
        if (lVar24 == 1) {
          lVar24 = 0;
          lVar20 = lVar25 + -0x103;
          goto LAB_003639ba;
        }
        lVar24 = lVar24 + -1;
        lVar20 = lVar20 + -1;
        lVar15 = lVar23 + 2;
      } while (lVar20 != 0);
      lVar20 = 0;
      lVar24 = 0x104 - lVar25;
LAB_003639ba:
      if (lVar20 == 0) {
        *(undefined2 *)((long)local_468 + lVar23 + 2U) = 0;
        lVar20 = 0;
      }
    }
LAB_003639cb:
    if (lVar24 == 0) {
      if (lVar20 != -1) goto LAB_00363a0a;
      buffer[0xff] = L'\0';
    }
    else if (0x105U - lVar24 < 0x104) {
      pcVar21 = local_468 + (0x105U - lVar24);
      __n = lVar24 * 2 - 2;
      goto LAB_003639f4;
    }
  }
  DVar5 = GetCurrentProcessId();
  pcVar21 = (char16_t *)((long)local_468 + lVar18);
  if (lVar18 == 0x208 || pcVar21 == (char16_t *)0x0) {
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else {
    _itow(DVar5,pcVar21,10);
  }
  sVar9 = PAL_wcslen(pcVar21);
  pcVar21 = pcVar21 + sVar9;
  sVar10 = PAL_wcslen(pcVar21);
  lVar25 = sVar10 + lVar25 + -0x104;
  if (pcVar21 == (char16_t *)0x0 || lVar25 == 0) {
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else {
    uVar13 = -lVar25;
    if (lVar18 + (long)outputFile == -10) {
      *pcVar21 = L'\0';
    }
    else {
      lVar18 = -(long)outputFile;
      uVar16 = uVar13;
      do {
        sVar2 = *(short *)((long)pcVar8 + (long)outputFile + 10 + lVar18);
        *(short *)((long)local_468 + (long)(pcVar8 + sVar9) + lVar18) = sVar2;
        if (sVar2 == 0) goto LAB_00363b12;
        lVar18 = lVar18 + 2;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
      uVar16 = 0;
LAB_00363b12:
      if (uVar16 != 0) {
        uVar16 = (uVar13 - uVar16) + 1;
        if (uVar16 <= uVar13 && uVar13 - uVar16 != 0) {
          memset(pcVar21 + uVar16,0xfd,(uVar13 - uVar16) * 2);
        }
        goto LAB_00363b80;
      }
      *pcVar21 = L'\0';
    }
    if (1 < uVar13) {
      memset(pcVar21 + 1,0xfd,lVar25 * -2 - 2);
    }
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
LAB_00363b80:
  outputFile = local_468;
LAB_00363b87:
  PlatformAgnostic::SystemInfo::GetBinaryLocation(&local_678,0x104);
  uVar13 = (ulong)(local_672 == 0x5c &&
                  (local_674 == 0x3f && (sStack_676 == 0x5c && (short)_local_678 == 0x5c)));
  bVar26 = (&local_678)[uVar13 * 4] == L'\0';
  lVar18 = uVar13 * 8 + 2;
  if (bVar26) {
    lVar18 = uVar13 * 8;
  }
  psVar1 = &local_674;
  if (bVar26) {
    psVar1 = &sStack_676;
  }
  _Src = psVar1 + uVar13 * 4;
  if (*(short *)((long)&local_678 + lVar18) != 0x3a) {
    _Src = &local_678 + uVar13 * 4;
  }
  pWVar19 = (WCHAR *)0x0;
  pWVar11 = (WCHAR *)0x0;
  pWVar17 = _Src;
  pWVar22 = _Src;
  do {
    WVar3 = *pWVar22;
    pWVar12 = pWVar11;
    if ((ushort)WVar3 < 0x2f) {
      pWVar12 = pWVar22;
      if ((WVar3 != L'.') && (pWVar12 = pWVar11, WVar3 == L'\0')) break;
    }
    else if ((WVar3 == L'\\') || (WVar3 == L'/')) {
      pWVar19 = pWVar22 + 1;
    }
    pWVar22 = pWVar22 + 1;
    pWVar17 = pWVar17 + 1;
    pWVar11 = pWVar12;
  } while( true );
  if (pWVar19 != (WCHAR *)0x0) {
    _Src = pWVar19;
  }
  if ((pWVar11 == (WCHAR *)0x0) || (pWVar11 < _Src)) {
    uVar13 = (long)pWVar17 - (long)_Src >> 1;
    if (0x103 < uVar13) goto LAB_00363c86;
LAB_00363c7f:
    wcsncpy_s(&local_258,0x104,_Src,uVar13);
  }
  else {
    uVar13 = (long)pWVar11 - (long)_Src >> 1;
    if (uVar13 < 0x104) goto LAB_00363c7f;
LAB_00363c86:
    local_258 = L'\0';
    memset(local_256,0xfd,0x206);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  iVar6 = _wcsicmp(&local_258,L"WWAHost");
  if ((((iVar6 != 0) && (iVar6 = _wcsicmp(&local_258,L"ByteCodeGenerator"), iVar6 != 0)) &&
      (iVar6 = _wcsicmp(&local_258,L"spartan"), iVar6 != 0)) &&
     (iVar6 = _wcsicmp(&local_258,L"spartan_edge"), iVar6 != 0)) {
    sVar9 = PAL_wcslen(L"MicrosoftEdge");
    iVar6 = _wcsnicmp(&local_258,L"MicrosoftEdge",sVar9);
    if (iVar6 != 0) goto LAB_00363f27;
  }
  DVar5 = GetEnvironmentVariableW(L"temp",&local_258,0x104);
  if (DVar5 != 0) {
    lVar18 = -0x104;
    do {
      if (fileName[lVar18 + 0x100] == L'\0') {
        lVar25 = -lVar18;
        lVar20 = 0;
        goto LAB_00363ddb;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0);
    goto LAB_00363e3a;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar14 = 1;
  bVar26 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                      ,700,"(0)","Get temp environment failed");
  if (!bVar26) goto LAB_00363fd3;
  *puVar14 = 0;
  outputFile = &local_258;
  goto LAB_00363f27;
  while( true ) {
    lVar20 = lVar20 + 2;
    lVar25 = lVar25 + -1;
    if (lVar25 == 0) break;
LAB_00363ddb:
    sVar2 = *(short *)((long)L"\\" + lVar20);
    *(short *)((long)fileName + lVar18 * 2 + lVar20 + 0x200) = sVar2;
    if (sVar2 == 0) goto LAB_00363e05;
  }
  lVar25 = 0;
LAB_00363e05:
  if (lVar25 == 0) {
LAB_00363e3a:
    local_258 = L'\0';
    memset(local_256,0xfd,0x206);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else if (0x105U - lVar25 < 0x104) {
    memset(local_256 + (0x105U - lVar25) * 2 + -2,0xfd,lVar25 * 2 - 2);
  }
  pcVar8 = PAL_wcsrchr(outputFile,L'\\');
  if (pcVar8 == (char16_t *)0x0) {
    pcVar8 = outputFile;
  }
  if (pcVar8 != (char16_t *)0x0) {
    lVar18 = -0x104;
    do {
      if (fileName[lVar18 + 0x100] == L'\0') {
        lVar25 = -lVar18;
        lVar20 = 0;
        goto LAB_00363e9d;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0);
  }
LAB_00363efb:
  local_258 = L'\0';
  memset(local_256,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  outputFile = &local_258;
  goto LAB_00363f27;
  while( true ) {
    lVar20 = lVar20 + 2;
    lVar25 = lVar25 + -1;
    if (lVar25 == 0) break;
LAB_00363e9d:
    sVar2 = *(short *)((long)pcVar8 + lVar20);
    *(short *)((long)fileName + lVar18 * 2 + lVar20 + 0x200) = sVar2;
    if (sVar2 == 0) goto LAB_00363ec7;
  }
  lVar25 = 0;
LAB_00363ec7:
  if (lVar25 == 0) goto LAB_00363efb;
  outputFile = &local_258;
  if (0x105U - lVar25 < 0x104) {
    memset(local_256 + (0x105U - lVar25) * 2 + -2,0xfd,lVar25 * 2 - 2);
  }
LAB_00363f27:
  file = _wfsopen(outputFile,openMode,0x20);
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar26 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                        ,0x2c8,"(false)","Could not open file for logging output.");
    if (!bVar26) {
LAB_00363fd3:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar14 = 0;
    HVar7 = -0x7fffbffb;
  }
  else {
    Output::SetOutputFile(file);
    HVar7 = 0;
  }
  return HVar7;
}

Assistant:

HRESULT ConfigParser::SetOutputFile(const WCHAR* outputFile, const WCHAR* openMode)
{
    // If present, replace the {PID} token with the process ID
    const WCHAR* pidStr = nullptr;
    WCHAR buffer[_MAX_PATH];
    if ((pidStr = wcsstr(outputFile, _u("{PID}"))) != nullptr)
    {
        size_t pidStartPosition = pidStr - outputFile;

        WCHAR* pDest = buffer;
        size_t bufferLen = _MAX_PATH;

        // Copy the filename before the {PID} token
        wcsncpy_s(pDest, bufferLen, outputFile, pidStartPosition);
        pDest += pidStartPosition;
        bufferLen = bufferLen - pidStartPosition;

        // Copy the PID
        _itow_s(GetCurrentProcessId(), pDest, /*bufferSize=*/_MAX_PATH - pidStartPosition, /*radix=*/10);
#pragma prefast(suppress: 26014, "ultow string length is smaller than 256")
        pDest += wcslen(pDest);
        bufferLen = bufferLen - wcslen(pDest);

        // Copy the rest of the string.
#pragma prefast(suppress: 26014, "Overwriting pDset's null terminator is intentional since the string being copied is null terminated")
        wcscpy_s(pDest, bufferLen, outputFile + pidStartPosition + /*length of {PID}*/ 5);

        outputFile = buffer;
    }

    char16 fileName[_MAX_PATH];
    char16 moduleName[_MAX_PATH];
    PlatformAgnostic::SystemInfo::GetBinaryLocation(moduleName, _MAX_PATH);
    _wsplitpath_s(moduleName, nullptr, 0, nullptr, 0, fileName, _MAX_PATH, nullptr, 0);
    if (_wcsicmp(fileName, _u("WWAHost")) == 0 ||
        _wcsicmp(fileName, _u("ByteCodeGenerator")) == 0 ||
        _wcsicmp(fileName, _u("spartan")) == 0 ||
        _wcsicmp(fileName, _u("spartan_edge")) == 0 ||
        _wcsnicmp(fileName, _u("MicrosoftEdge"), wcslen(_u("MicrosoftEdge"))) == 0)
    {

        // we need to output to %temp% directory in wwa. we don't have permission otherwise.
        if (GetEnvironmentVariable(_u("temp"), fileName, _MAX_PATH) != 0)
        {
            wcscat_s(fileName, _MAX_PATH, _u("\\"));
            const char16 * fileNameOnly = wcsrchr(outputFile, _u('\\'));
            // if outputFile is full path we just need filename, discard the path
            wcscat_s(fileName, _MAX_PATH, fileNameOnly == nullptr ? outputFile : fileNameOnly);
        }
        else
        {
            AssertMsg(FALSE, "Get temp environment failed");
        }
        outputFile = fileName;
    }

    FILE *fp;
    if ((fp = _wfsopen(outputFile, openMode, _SH_DENYWR)) != nullptr)
    {
        Output::SetOutputFile(fp);
        return S_OK;
    }

    AssertMsg(false, "Could not open file for logging output.");
    return E_FAIL;
}